

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::H2V1Convert(jpeg_decoder *this)

{
  int iVar1;
  uint8 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int yy;
  int bc;
  int gc;
  int rc;
  int cr;
  int cb;
  int j;
  int l;
  int i;
  uint8 *c;
  uint8 *y;
  uint8 *d0;
  int row;
  jpeg_decoder *this_local;
  
  iVar4 = this->m_max_mcu_y_size - this->m_mcu_lines_left;
  y = this->m_pScan_line_0;
  c = this->m_pSample_buf + iVar4 * 8;
  _l = this->m_pSample_buf + (long)(iVar4 * 8) + 0x80;
  for (j = this->m_max_mcus_per_row; 0 < j; j = j + -1) {
    for (cb = 0; cb < 2; cb = cb + 1) {
      for (cr = 0; cr < 4; cr = cr + 1) {
        iVar4 = this->m_crr[(int)(uint)_l[0x40]];
        iVar5 = this->m_crg[(int)(uint)_l[0x40]] + this->m_cbg[(int)(uint)*_l] >> 0x10;
        iVar1 = this->m_cbb[(int)(uint)*_l];
        uVar3 = (uint)c[cr << 1];
        uVar2 = clamp(uVar3 + iVar4);
        *y = uVar2;
        uVar2 = clamp(uVar3 + iVar5);
        y[1] = uVar2;
        uVar2 = clamp(uVar3 + iVar1);
        y[2] = uVar2;
        y[3] = 0xff;
        uVar3 = (uint)c[cr * 2 + 1];
        uVar2 = clamp(uVar3 + iVar4);
        y[4] = uVar2;
        uVar2 = clamp(uVar3 + iVar5);
        y[5] = uVar2;
        uVar2 = clamp(uVar3 + iVar1);
        y[6] = uVar2;
        y[7] = 0xff;
        y = y + 8;
        _l = _l + 1;
      }
      c = c + 0x40;
    }
    c = c + 0x80;
    _l = _l + 0xf8;
  }
  return;
}

Assistant:

void jpeg_decoder::H2V1Convert()
{
  int row = m_max_mcu_y_size - m_mcu_lines_left;
  uint8 *d0 = m_pScan_line_0;
  uint8 *y = m_pSample_buf + row * 8;
  uint8 *c = m_pSample_buf + 2*64 + row * 8;

  for (int i = m_max_mcus_per_row; i > 0; i--)
  {
    for (int l = 0; l < 2; l++)
    {
      for (int j = 0; j < 4; j++)
      {
        int cb = c[0];
        int cr = c[64];

        int rc = m_crr[cr];
        int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
        int bc = m_cbb[cb];

        int yy = y[j<<1];
        d0[0] = clamp(yy+rc);
        d0[1] = clamp(yy+gc);
        d0[2] = clamp(yy+bc);
        d0[3] = 255;

        yy = y[(j<<1)+1];
        d0[4] = clamp(yy+rc);
        d0[5] = clamp(yy+gc);
        d0[6] = clamp(yy+bc);
        d0[7] = 255;

        d0 += 8;

        c++;
      }
      y += 64;
    }

    y += 64*4 - 64*2;
    c += 64*4 - 8;
  }
}